

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O2

char * btorsim_bv_to_hex_char(BtorSimBitVector *bv)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  byte bVar4;
  uint uVar5;
  size_t in_RSI;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  uVar8 = bv->width + 3 >> 2;
  pcVar3 = (char *)btorsim_calloc((ulong)(uVar8 + 1),in_RSI);
  uVar2 = bv->width;
  uVar6 = 0;
  while (uVar6 < uVar2) {
    uVar8 = uVar8 - 1;
    uVar7 = (uint)(((&bv[1].width)[~(uVar6 >> 5) + bv->len] >> (uVar6 & 0x1f) & 1) != 0);
    for (uVar5 = 1; (uVar1 = uVar6 + uVar5, uVar1 < uVar2 && (uVar5 < 4)); uVar5 = uVar5 + 1) {
      uVar7 = uVar7 | (uint)(((&bv[1].width)[~(uVar1 >> 5) + bv->len] >> (uVar1 & 0x1f) & 1) != 0)
                      << ((byte)uVar5 & 0x1f);
    }
    bVar4 = (byte)uVar7 + 0x57;
    if (uVar7 < 10) {
      bVar4 = (byte)uVar7 | 0x30;
    }
    pcVar3[uVar8] = bVar4;
    uVar6 = uVar1;
  }
  return pcVar3;
}

Assistant:

char *
btorsim_bv_to_hex_char (const BtorSimBitVector *bv)
{
  assert (bv);

  uint32_t len, i, j, k, tmp;
  char *res, ch;

  len = (bv->width + 3) / 4;
  BTOR2_CNEWN (res, len + 1);
  for (i = 0, j = len - 1; i < bv->width;)
  {
    tmp = btorsim_bv_get_bit (bv, i++);
    for (k = 1; i < bv->width && k <= 3; i++, k++)
      tmp |= btorsim_bv_get_bit (bv, i) << k;
    ch       = tmp < 10 ? '0' + tmp : 'a' + (tmp - 10);
    res[j--] = ch;
  }

  return res;
}